

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

int Gia_ManFindDivGateInt
              (word *pOff,word *pOn,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t *vUnateLits,
              Vec_Int_t *vUnatePairs,Vec_Int_t *vUnateLitsW,Vec_Int_t *vUnatePairsW,word *pDivTemp)

{
  int iVar1;
  uint iDiv;
  void *pvVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  uVar10 = (ulong)(uint)nWords;
  if (nWords < 1) {
    iVar4 = 0;
  }
  else {
    uVar3 = 0;
    iVar4 = 0;
    do {
      uVar8 = pOn[uVar3] - (pOn[uVar3] >> 1 & 0x5555555555555555);
      uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
      uVar8 = (uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f;
      uVar8 = (uVar8 >> 8) + uVar8;
      lVar9 = (uVar8 >> 0x10) + uVar8;
      iVar4 = iVar4 + ((int)((ulong)lVar9 >> 0x20) + (int)lVar9 & 0xffU);
      uVar3 = uVar3 + 1;
    } while (uVar10 != uVar3);
  }
  iVar5 = vUnateLits->nSize;
  if (0 < iVar5) {
    lVar9 = 0;
    do {
      if (vUnateLitsW->nSize <= lVar9) {
LAB_007a6f24:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar6 = vUnateLits->pArray[lVar9];
      if ((int)uVar6 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (vDivs->nSize <= (int)(uVar6 >> 1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar1 = vUnateLitsW->pArray[lVar9];
      if (iVar1 * 2 < iVar4) {
        return -1;
      }
      if (0 < vUnatePairs->nSize) {
        pvVar2 = vDivs->pArray[uVar6 >> 1];
        lVar7 = 0;
        do {
          if (vUnatePairsW->nSize <= lVar7) goto LAB_007a6f24;
          iDiv = vUnatePairs->pArray[lVar7];
          if ((int)iDiv < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          if (vUnatePairsW->pArray[lVar7] + iVar1 < iVar4) break;
          Gia_ManDeriveDivPair(iDiv,vDivs,nWords,pDivTemp);
          if ((iDiv & 1) == 0 && (uVar6 & 1) == 0) {
            if (nWords < 1) goto LAB_007a6ef8;
            uVar3 = 0;
            while ((pOn[uVar3] & ~(pDivTemp[uVar3] | *(ulong *)((long)pvVar2 + uVar3 * 8))) == 0) {
              uVar3 = uVar3 + 1;
              if (uVar10 == uVar3) goto LAB_007a6ef8;
            }
          }
          else if ((uVar6 & 1) == 0) {
            if (nWords < 1) goto LAB_007a6ef8;
            uVar3 = 0;
            while ((pOn[uVar3] & ~*(ulong *)((long)pvVar2 + uVar3 * 8) & pDivTemp[uVar3]) == 0) {
              uVar3 = uVar3 + 1;
              if (uVar10 == uVar3) goto LAB_007a6ef8;
            }
          }
          else if ((iDiv & 1) == 0) {
            if (nWords < 1) {
LAB_007a6ef8:
              uVar6 = (int)lVar7 << 0x10 | uVar6;
              if (-1 < (int)uVar6) {
                return uVar6 * 2 & 0xfffefffe ^ 0x10003;
              }
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            uVar3 = 0;
            while ((pOn[uVar3] & ~pDivTemp[uVar3] & *(ulong *)((long)pvVar2 + uVar3 * 8)) == 0) {
              uVar3 = uVar3 + 1;
              if (uVar10 == uVar3) goto LAB_007a6ef8;
            }
          }
          else {
            if (nWords < 1) goto LAB_007a6ef8;
            uVar3 = 0;
            while ((pOn[uVar3] & pDivTemp[uVar3] & *(ulong *)((long)pvVar2 + uVar3 * 8)) == 0) {
              uVar3 = uVar3 + 1;
              if (uVar10 == uVar3) goto LAB_007a6ef8;
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < vUnatePairs->nSize);
        iVar5 = vUnateLits->nSize;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar5);
  }
  return -1;
}

Assistant:

int Gia_ManFindDivGateInt( word * pOff, word * pOn, Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnateLits, Vec_Int_t * vUnatePairs, Vec_Int_t * vUnateLitsW, Vec_Int_t * vUnatePairsW, word * pDivTemp )
{
    int i, k, iDiv0, iDiv1, Cover0, Cover1;
    int nTotal = Abc_TtCountOnesVec( pOn, nWords );
    Vec_IntForEachEntryTwo( vUnateLits, vUnateLitsW, iDiv0, Cover0, i )
    {
        word * pDiv0 = (word *)Vec_PtrEntry(vDivs, Abc_Lit2Var(iDiv0));
        if ( 2*Cover0 < nTotal )
            break;
        Vec_IntForEachEntryTwo( vUnatePairs, vUnatePairsW, iDiv1, Cover1, k )
        {
            int fComp1 = Abc_LitIsCompl(iDiv1);
            if ( Cover0 + Cover1 < nTotal )
                break;
            Gia_ManDeriveDivPair( iDiv1, vDivs, nWords, pDivTemp );
            if ( Gia_ManDivCover(pOff, pOn, pDiv0, Abc_LitIsCompl(iDiv0), pDivTemp, fComp1, nWords) )
                return Abc_Var2Lit((Abc_Var2Lit(k, 1) << 15) | Abc_LitNot(iDiv0), 1);
        }
    }
    return -1;
}